

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_dileaveBytes_random_::run
          (Test_bitileave_ileaveBytes_dileaveBytes_random_ *this)

{
  undefined1 auVar1 [16];
  SourceLocation loc;
  bool bVar2;
  uint64_t local_188;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_160;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_129;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string_view local_88;
  undefined4 local_74;
  unsigned_long *puStack_70;
  Cmp cmp_;
  uint64_t *tr_;
  uint64_t *tl_;
  uint64_t dileaved;
  uint64_t ileaved;
  uint64_t bytesAsInt;
  uint64_t next;
  ulong uStack_38;
  uint8_t count;
  size_t i;
  uniform_int_distribution<unsigned_long> distr;
  fast_rng64 rng;
  size_t iterations;
  Test_bitileave_ileaveBytes_dileaveBytes_random_ *this_local;
  
  std::linear_congruential_engine<unsigned_long,_6364136223846793005UL,_1442695040888963407UL,_0UL>
  ::linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_6364136223846793005UL,_1442695040888963407UL,_0UL>
              *)&distr._M_param._M_b,0x3039);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&i);
  uStack_38 = 0;
  while( true ) {
    if (0x3fff < uStack_38) {
      return;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_38;
    next._7_1_ = SUB161(auVar1 % ZEXT816(9),0);
    bytesAsInt = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)&i,
                            (linear_congruential_engine<unsigned_long,_6364136223846793005UL,_1442695040888963407UL,_0UL>
                             *)&distr._M_param._M_b);
    if (next._7_1_ == 0) {
      local_188 = 0;
    }
    else {
      local_188 = bytesAsInt >> (('\b' - next._7_1_) * '\b' & 0x3f);
    }
    ileaved = local_188;
    dileaved = ileaveBytes(local_188,(ulong)next._7_1_);
    tl_ = (uint64_t *)dileave_bytes(dileaved,(ulong)next._7_1_);
    tr_ = (uint64_t *)&tl_;
    puStack_70 = &ileaved;
    local_74 = 0;
    bVar2 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>(tr_,puStack_70);
    local_129 = 0;
    local_13d = 0;
    local_13e = 0;
    if (!bVar2) break;
    local_129 = 0;
    local_13d = 0;
    local_13e = 0;
    uStack_38 = uStack_38 + 1;
  }
  stringify<unsigned_long>(&local_128,tr_);
  local_129 = 1;
  std::operator+(&local_108,"Comparison failed: dileaved == bytesAsInt (with \"dileaved\"=",
                 &local_128);
  local_13d = 1;
  std::operator+(&local_e8,&local_108,", \"bytesAsInt\"=");
  local_13e = 1;
  stringify<unsigned_long>(&local_160,puStack_70);
  std::operator+(&local_c8,&local_e8,&local_160);
  std::operator+(&local_a8,&local_c8,")");
  local_88 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0xf8;
  assertFail(local_88,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_dileaveBytes_random)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint8_t count = i % 9;
        std::uint64_t next = distr(rng);
        std::uint64_t bytesAsInt = count == 0 ? 0 : next >> ((8 - count) * 8);

        std::uint64_t ileaved = ileaveBytes(bytesAsInt, count);
        std::uint64_t dileaved = dileave_bytes(ileaved, count);

        BITMANIP_ASSERT_EQ(dileaved, bytesAsInt);
    }
}